

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandIf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pAVar5;
  size_t sVar6;
  If_DsdMan_t *pIVar7;
  char *pcVar8;
  double dVar9;
  char *local_298;
  uint local_288;
  bool local_281;
  If_DsdMan_t *p;
  int LutSize_1;
  If_DsdMan_t *pDsdMan;
  int c;
  If_Par_t *pPars;
  If_Par_t Pars;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char LutSize [100];
  char local_98 [8];
  char Buffer [100];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar5 = Abc_FrameReadNtk(pAbc);
  If_ManSetDefaultPars((If_Par_t *)&pPars);
  Pars._240_8_ = Abc_FrameReadLibLut();
  Extra_UtilGetoptReset();
LAB_0022eacf:
  iVar3 = Extra_UtilGetopt(argc,argv,"KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh");
  if (iVar3 == -1) {
    if (pAVar5 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    if ((uint)pPars == 0xffffffff) {
      if (Pars._240_8_ == 0) {
        Abc_Print(-1,"The LUT library is not given.\n");
        return 1;
      }
      pPars._0_4_ = *(uint *)(Pars._240_8_ + 8);
    }
    if (((int)(uint)pPars < 2) || (0x20 < (int)(uint)pPars)) {
      Abc_Print(-1,"Incorrect LUT size (%d).\n",(ulong)(uint)pPars);
      return 1;
    }
    if (((int)pPars._4_4_ < 1) || (0xfff < (int)pPars._4_4_)) {
      Abc_Print(-1,"Incorrect number of cuts.\n");
      return 1;
    }
    iVar3 = Abc_NtkGetChoiceNum(pAVar5);
    if (iVar3 != 0) {
      Pars.fArea = 0;
    }
    if (Pars.fBidec != 0) {
      if (((int)(uint)pPars < 4) || (6 < (int)(uint)pPars)) {
        Abc_Print(-1,"This feature only works for {4,5,6}-LUTs.\n");
        return 1;
      }
      Pars.fEdge = 1;
    }
    if (1 < (int)(Pars.fUseBat + Pars.fUseDsd + Pars.fEnableCheck75u + (uint)(Pars._160_8_ != 0))) {
      Abc_Print(-1,"Only one additional check can be performed at the same time.\n");
      return 1;
    }
    if (Pars.fUseBat != 0) {
      if (((int)(uint)pPars < 6) || (7 < (int)(uint)pPars)) {
        Abc_Print(-1,"This feature only works for {6,7}-LUTs.\n");
        return 1;
      }
      Pars.pFuncUser = If_CutPerformCheck07;
      Pars.fEdge = 1;
    }
    if (Pars.fUseDsd != 0) {
      if (((uint)pPars & 1) == 0) {
        Abc_Print(-1,"This feature only works for odd-sized LUTs.\n");
        return 1;
      }
      Pars.fEdge = 1;
    }
    if (Pars.fEnableCheck75u != 0) {
      pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      uVar4 = (uint)pPars;
      if (pIVar7 == (If_DsdMan_t *)0x0) {
        Abc_Print(-1,"DSD manager is not available.\n");
        return 1;
      }
      iVar3 = If_DsdManVarNum(pIVar7);
      uVar2 = (uint)pPars;
      if (iVar3 < (int)uVar4) {
        uVar4 = If_DsdManVarNum(pIVar7);
        Abc_Print(-1,"LUT size (%d) is more than the number of variables in the DSD manager (%d).\n"
                  ,(ulong)uVar2,(ulong)uVar4);
        return 1;
      }
      if ((Pars.fUseAndVars != 0) && (pcVar8 = If_DsdManGetCellStr(pIVar7), pcVar8 == (char *)0x0))
      {
        Abc_Print(-1,"DSD manager is not matched with any particular cell.\n");
        return 1;
      }
      Pars.fEdge = 1;
      Pars.fEnableCheck75 = 1;
      If_DsdManSetNewAsUseless(pIVar7);
    }
    if (Pars._160_8_ != 0) {
      if (Pars.fDelayOpt != 0) {
        Abc_Print(-1,"Incompatible options (-S and -x).\n");
        return 1;
      }
      if (((int)(uint)pPars < 6) || (0x10 < (int)(uint)pPars)) {
        Abc_Print(-1,"This feature only works for [6;16]-LUTs.\n");
        return 1;
      }
      Pars.pFuncUser = If_CutPerformCheck16;
      if (Pars.fCutMin != 0) {
        Pars.pFuncUser = (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0;
      }
      Pars.fEdge = 1;
    }
    if (Pars.fEdge != 0) {
      Pars.fSkipCutFilter = 1;
      Pars.fArea = 0;
    }
    if (Pars.fDelayOptLut != 0) {
      Pars.fSkipCutFilter = 1;
      Pars.fEdge = 1;
      Pars.fArea = 0;
      Pars.fAreaOnly = 1;
      Pars.FinalDelay = 0.0;
      Pars.FinalArea = 0.0;
    }
    if (((Pars.fPower != 0) || (Pars.fDelayOpt != 0)) || (Pars.fCutMin != 0)) {
      Pars.fSkipCutFilter = 1;
      Pars.fEdge = 1;
      Pars.fArea = 0;
      local_281 = Pars.fDelayOpt != 0 || Pars.fCutMin != 0;
      Pars.fEnableCheck75 = (int)local_281;
      Pars.FinalDelay = 0.0;
      Pars.FinalArea = 0.0;
    }
    if (0 < Pars.nFlowIters) {
      Pars.fSkipCutFilter = 1;
      Pars.fEdge = 1;
      Pars.fArea = 0;
      Pars.fAreaOnly = 1;
      Pars.FinalDelay = 0.0;
      Pars.FinalArea = 0.0;
      pPars._0_4_ = Pars.nFlowIters;
    }
    if ((Pars.fEnableCheck75 != 0) || (Pars.fUseCofVars != 0)) {
      Pars.fSkipCutFilter = 1;
      Pars.fEdge = 1;
      Pars.fArea = 0;
    }
    if (Pars.fEnableCheck75 != 0) {
      if ((Pars._160_8_ == 0) || (*(char *)(Pars._160_8_ + 2) != '\0')) {
        local_288 = 0;
      }
      else {
        local_288 = (int)*(char *)Pars._160_8_ - 0x30;
      }
      pIVar7 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      uVar4 = (uint)pPars;
      if ((Pars._160_8_ != 0) && (*(char *)(Pars._160_8_ + 2) != '\0')) {
        printf("DSD only works for LUT structures XY.\n");
        return 0;
      }
      if ((pIVar7 != (If_DsdMan_t *)0x0) && (iVar3 = If_DsdManVarNum(pIVar7), iVar3 < (int)uVar4)) {
        printf("DSD manager has incompatible number of variables.\n");
        return 0;
      }
      if (((pIVar7 != (If_DsdMan_t *)0x0) && (uVar4 = If_DsdManLutSize(pIVar7), local_288 != uVar4))
         && (Pars.fDelayOpt == 0)) {
        printf("DSD manager has different LUT size.\n");
        return 0;
      }
      if (pIVar7 == (If_DsdMan_t *)0x0) {
        if ((0xc < (int)local_288) || (0xc < (int)(uint)pPars)) {
          printf("Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                 ,(ulong)local_288,0xc);
          return 0;
        }
        pIVar7 = If_DsdManAlloc((uint)pPars,local_288);
        Abc_FrameSetManDsd(pIVar7);
      }
    }
    if (Pars.fDelayOptLut != 0) {
      iVar3 = Abc_NtkRecIsRunning3();
      if (iVar3 == 0) {
        printf("LMS manager is not running (use \"rec_start3\").\n");
        return 0;
      }
      uVar4 = Abc_NtkRecInputNum3();
      if (uVar4 != (uint)pPars) {
        uVar4 = Abc_NtkRecInputNum3();
        printf("The number of library inputs (%d) different from the K parameters (%d).\n",
               (ulong)uVar4,(ulong)(uint)pPars);
        return 0;
      }
    }
    if ((Pars.fSkipCutFilter != 0) && (0xf < (int)(uint)pPars)) {
      Abc_Print(-1,"Truth tables cannot be computed for LUT larger than %d inputs.\n",0xf);
      return 1;
    }
    iVar3 = Abc_NtkIsStrash(pAVar5);
    if (iVar3 == 0) {
      Pars.pReoMan = Abc_NtkStrash(pAVar5,0,0,0);
      if ((Abc_Ntk_t *)Pars.pReoMan == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Strashing before FPGA mapping has failed.\n");
        return 1;
      }
      pAVar5 = Abc_NtkBalance((Abc_Ntk_t *)Pars.pReoMan,0,0,1);
      Abc_NtkDelete((Abc_Ntk_t *)Pars.pReoMan);
      if (pAVar5 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Balancing before FPGA mapping has failed.\n");
        return 1;
      }
      pcVar8 = Abc_FrameReadFlag("silentmode");
      if (pcVar8 == (char *)0x0) {
        Abc_Print(1,"The network was strashed and balanced before FPGA mapping.\n");
      }
      Pars.pReoMan = Abc_NtkIf(pAVar5,(If_Par_t *)&pPars);
      if ((Abc_Ntk_t *)Pars.pReoMan == (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pAVar5);
        Abc_Print(-1,"FPGA mapping has failed.\n");
        return 0;
      }
      Abc_NtkDelete(pAVar5);
    }
    else {
      Pars.pReoMan = Abc_NtkIf(pAVar5,(If_Par_t *)&pPars);
      if ((Abc_Ntk_t *)Pars.pReoMan == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"FPGA mapping has failed.\n");
        return 0;
      }
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)Pars.pReoMan);
    return 0;
  }
  switch(iVar3) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by a positive integer.\n");
      goto LAB_0022fe6f;
    }
    Pars.nCutsMax = atoi(argv[globalUtilOptind]);
    fVar1 = (float)Pars.nCutsMax;
    break;
  default:
    goto switchD_0022eb21_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
      goto LAB_0022fe6f;
    }
    pPars._4_4_ = (float)atoi(argv[globalUtilOptind]);
    fVar1 = pPars._4_4_;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by a floating point number.\n");
      goto LAB_0022fe6f;
    }
    dVar9 = atof(argv[globalUtilOptind]);
    Pars.nGateSize = (int)(float)dVar9;
    globalUtilOptind = globalUtilOptind + 1;
    if ((float)Pars.nGateSize <= 0.0) goto LAB_0022fe6f;
    goto LAB_0022eacf;
  case 0x45:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-E\" should be followed by a floating point number.\n");
      goto LAB_0022fe6f;
    }
    dVar9 = atof(argv[globalUtilOptind]);
    Pars.nNonDecLimit = (int)(float)dVar9;
    globalUtilOptind = globalUtilOptind + 1;
    if (((float)Pars.nNonDecLimit < 0.0) || (1.0 < (float)Pars.nNonDecLimit)) goto LAB_0022fe6f;
    goto LAB_0022eacf;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by a positive integer.\n");
      goto LAB_0022fe6f;
    }
    Pars.nLutSize = atoi(argv[globalUtilOptind]);
    fVar1 = (float)Pars.nLutSize;
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      Pars.nFlowIters = atoi(argv[globalUtilOptind]);
      iVar3 = Pars.nFlowIters;
      goto joined_r0x0022ee61;
    }
    Abc_Print(-1,
              "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n"
             );
    goto LAB_0022fe6f;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
      goto LAB_0022fe6f;
    }
    pPars._0_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)(uint)pPars < 0) goto LAB_0022fe6f;
    Pars.FinalDelay = 0.0;
    Pars.FinalArea = 0.0;
    goto LAB_0022eacf;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,
                "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n"
               );
      goto LAB_0022fe6f;
    }
    Pars.nAreaIters = atoi(argv[globalUtilOptind]);
    iVar3 = Pars.nAreaIters;
joined_r0x0022ee61:
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 2) goto LAB_0022fe6f;
    goto LAB_0022eacf;
  case 0x52:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.DelayTarget = (float)atoi(argv[globalUtilOptind]);
    fVar1 = Pars.DelayTarget;
    break;
  case 0x53:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by string.\n");
      goto LAB_0022fe6f;
    }
    Pars._160_8_ = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
    sVar6 = strlen((char *)Pars._160_8_);
    if ((sVar6 != 2) && (sVar6 = strlen((char *)Pars._160_8_), sVar6 != 3)) {
      Abc_Print(-1,
                "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
               );
      goto LAB_0022fe6f;
    }
    goto LAB_0022eacf;
  case 0x54:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n"
               );
      goto LAB_0022fe6f;
    }
    Pars.Epsilon = (float)atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (((int)Pars.Epsilon < 0) || (2 < (int)Pars.Epsilon)) goto LAB_0022fe6f;
    goto LAB_0022eacf;
  case 0x57:
    if (globalUtilOptind < argc) goto LAB_0022f127;
    Abc_Print(-1,"Command line switch \"-W\" should be followed by a floating point number.\n");
    goto LAB_0022fe6f;
  case 0x58:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n"
               );
      goto LAB_0022fe6f;
    }
    Pars.nRelaxRatio = atoi(argv[globalUtilOptind]);
    fVar1 = (float)Pars.nStructType;
    break;
  case 0x59:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n"
               );
      goto LAB_0022fe6f;
    }
    Pars.nStructType = atoi(argv[globalUtilOptind]);
    fVar1 = (float)Pars.nRelaxRatio;
    break;
  case 0x61:
    Pars.nAndArea = Pars.nAndArea ^ 1;
    goto LAB_0022eacf;
  case 0x62:
    Pars.fBidec = Pars.fBidec ^ 1;
    goto LAB_0022eacf;
  case 99:
    Pars.fUseCofVars = Pars.fUseCofVars ^ 1;
    goto LAB_0022eacf;
  case 100:
    Pars.fDsdBalance = Pars.fDsdBalance ^ 1;
    goto LAB_0022eacf;
  case 0x65:
    Pars.fExpRed = Pars.fExpRed ^ 1;
    goto LAB_0022eacf;
  case 0x66:
    Pars.fPreprocess = Pars.fPreprocess ^ 1;
    goto LAB_0022eacf;
  case 0x67:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_0022eacf;
  case 0x68:
switchD_0022eb21_caseD_42:
    goto LAB_0022fe6f;
  case 0x69:
    Pars.fUseDsd = Pars.fUseDsd ^ 1;
    goto LAB_0022eacf;
  case 0x6a:
    Pars.fUseBat = Pars.fUseBat ^ 1;
    goto LAB_0022eacf;
  case 0x6b:
    Pars.fEnableCheck75u = Pars.fEnableCheck75u ^ 1;
    goto LAB_0022eacf;
  case 0x6c:
    Pars.fFancy = Pars.fFancy ^ 1;
    goto LAB_0022eacf;
  case 0x6d:
    Pars.fEdge = Pars.fEdge ^ 1;
    goto LAB_0022eacf;
  case 0x6e:
    Pars.fEnableCheck75 = Pars.fEnableCheck75 ^ 1;
    goto LAB_0022eacf;
  case 0x6f:
    Pars.fUse34Spec = Pars.fUse34Spec ^ 1;
    goto LAB_0022eacf;
  case 0x70:
    Pars.fLatchPaths = Pars.fLatchPaths ^ 1;
    goto LAB_0022eacf;
  case 0x71:
    Pars.nAndDelay = Pars.nAndDelay ^ 1;
    goto LAB_0022eacf;
  case 0x72:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_0022eacf;
  case 0x73:
    Pars.fCutMin = Pars.fCutMin ^ 1;
    goto LAB_0022eacf;
  case 0x74:
    Pars.fUseTtPerm = Pars.fUseTtPerm ^ 1;
    goto LAB_0022eacf;
  case 0x76:
    Pars.fDeriveLuts = Pars.fDeriveLuts ^ 1;
    goto LAB_0022eacf;
  case 0x78:
    Pars.fDelayOpt = Pars.fDelayOpt ^ 1;
    goto LAB_0022eacf;
  case 0x79:
    Pars.fDelayOptLut = Pars.fDelayOptLut ^ 1;
    goto LAB_0022eacf;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)fVar1 < 0) goto LAB_0022fe6f;
  goto LAB_0022eacf;
LAB_0022f127:
  dVar9 = atof(argv[globalUtilOptind]);
  Pars.pLutStruct._0_4_ = (float)dVar9;
  globalUtilOptind = globalUtilOptind + 1;
  if (Pars.pLutStruct._0_4_ < 0.0) {
LAB_0022fe6f:
    if (((float)Pars.nGateSize != -1.0) || (NAN((float)Pars.nGateSize))) {
      sprintf(local_98,"%.2f",(double)(float)Pars.nGateSize);
    }
    else {
      sprintf(local_98,"best possible");
    }
    if ((uint)pPars == 0xffffffff) {
      sprintf((char *)&pNtk,"library");
    }
    else {
      sprintf((char *)&pNtk,"%d",(ulong)(uint)pPars);
    }
    Abc_Print(-2,"usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n");
    Abc_Print(-2,"\t           performs FPGA technology mapping of the network\n");
    Abc_Print(-2,"\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n",0x21,&pNtk)
    ;
    Abc_Print(-2,"\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n",
              (ulong)(uint)pPars._4_4_);
    Abc_Print(-2,
              "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n"
              ,(ulong)(uint)Pars.nLutSize);
    Abc_Print(-2,
              "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n"
              ,(ulong)(uint)Pars.nCutsMax);
    Abc_Print(-2,"\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n",
              (ulong)(uint)Pars.nFlowIters);
    Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
              (ulong)(uint)Pars.DelayTarget);
    Abc_Print(-2,"\t-N num   : the max size of non-decomposable nodes [default = unused]\n",
              (ulong)(uint)Pars.nAreaIters);
    Abc_Print(-2,"\t-T num   : the type of LUT structures [default = any]\n");
    Abc_Print(-2,"\t-X num   : delay of AND-gate in LUT library units [default = %d]\n",
              (ulong)(uint)Pars.nRelaxRatio);
    Abc_Print(-2,"\t-Y num   : area of AND-gate in LUT library units [default = %d]\n",
              (ulong)(uint)Pars.nStructType);
    Abc_Print(-2,"\t-D float : sets the delay constraint for the mapping [default = %s]\n",local_98)
    ;
    Abc_Print(-2,"\t-E float : sets epsilon used for tie-breaking [default = %f]\n",
              (double)(float)Pars.nNonDecLimit);
    Abc_Print(-2,"\t-W float : sets wire delay between adjects LUTs [default = %f]\n",
              (double)Pars.pLutStruct._0_4_);
    if (Pars._160_8_ == 0) {
      local_298 = "not used";
    }
    else {
      local_298 = (char *)Pars._160_8_;
    }
    Abc_Print(-2,"\t-S str   : string representing the LUT structure [default = %s]\n",local_298);
    pcVar8 = "no";
    if (Pars.nAndDelay != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-q       : toggles preprocessing using several starting points [default = %s]\n"
              ,pcVar8);
    pcVar8 = "no";
    if (Pars.nAndArea != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fArea != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-r       : enables expansion/reduction of the best cuts [default = %s]\n",pcVar8
             );
    pcVar8 = "no";
    if (Pars.fFancy != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,
              "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fExpRed != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-e       : uses edge-based cut selection heuristics [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fLatchPaths != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-p       : uses power-aware cut selection heuristics [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fEdge != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,
              "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n"
              ,pcVar8);
    pcVar8 = "no";
    if (Pars.fCutMin != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fDsdBalance != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fBidec != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-b       : toggles the use of one special feature [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fPower != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-g       : toggles delay optimization by SOP balancing [default = %s]\n",pcVar8)
    ;
    pcVar8 = "no";
    if (Pars.fDelayOpt != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-x       : toggles delay optimization by DSD balancing [default = %s]\n",pcVar8)
    ;
    pcVar8 = "no";
    if (Pars.fDelayOptLut != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-y       : toggles delay optimization with recorded library [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fUse34Spec != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,
              "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
              ,pcVar8);
    pcVar8 = "no";
    if (Pars.fUseBat != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-j       : toggles enabling additional check [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fUseDsd != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-i       : toggles using cofactoring variables [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fEnableCheck75u != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fUseTtPerm != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,
              "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n",
              pcVar8);
    pcVar8 = "no";
    if (Pars.fEnableCheck75 != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-n       : toggles computing DSDs of the cut functions [default = %s]\n",pcVar8)
    ;
    pcVar8 = "no";
    if (Pars.fUseCofVars != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-c       : toggles computing truth tables in a new way [default = %s]\n",pcVar8)
    ;
    pcVar8 = "no";
    if (Pars.fDeriveLuts != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar8);
    Abc_Print(-2,"\t-h       : prints the command usage\n");
    return 1;
  }
  goto LAB_0022eacf;
}

Assistant:

int Abc_CommandIf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    char Buffer[100], LutSize[100];
    Abc_Ntk_t * pNtk, * pNtkRes;
    If_Par_t Pars, * pPars = &Pars;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);
    If_ManSetDefaultPars( pPars );
    pPars->pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            // if the LUT size is specified, disable library
            pPars->pLutLib = NULL;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaIters < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nGateSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGateSize < 2 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nNonDecLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonDecLimit < 2 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nStructType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStructType < 0 || pPars->nStructType > 2 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndArea < 0 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndArea = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndDelay < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->Epsilon = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Epsilon < 0.0 || pPars->Epsilon > 1.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->WireDelay = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->WireDelay < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pLutStruct = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( strlen(pPars->pLutStruct) != 2 && strlen(pPars->pLutStruct) != 3 )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                goto usage;
            }
            break;
        case 'q':
            pPars->fPreprocess ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fExpRed ^= 1;
            break;
        case 'f':
            pPars->fFancy ^= 1;
            break;
        case 'l':
            pPars->fLatchPaths ^= 1;
            break;
        case 'e':
            pPars->fEdge ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 's':
            pPars->fDelayOptLut ^= 1;
            break;
        case 'd':
            pPars->fBidec ^= 1;
            break;
        case 'b':
            pPars->fUseBat ^= 1;
            break;
        case 'g':
            pPars->fDelayOpt ^= 1;
            break;
        case 'x':
            pPars->fDsdBalance ^= 1;
            break;
        case 'y':
            pPars->fUserRecLib ^= 1;
            break;
        case 'o':
            pPars->fUseBuffs ^= 1;
            break;
        case 'j':
            pPars->fEnableCheck07 ^= 1;
            break;
        case 'i':
            pPars->fUseCofVars ^= 1;
            break;
        case 'k':
            pPars->fUseDsdTune ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'n':
            pPars->fUseDsd ^= 1;
            break;
        case 'c':
            pPars->fUseTtPerm ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            Abc_Print( -1, "The LUT library is not given.\n" );
            return 1;
        }
        pPars->nLutSize = pPars->pLutLib->LutMax;
    }

    if ( pPars->nLutSize < 2 || pPars->nLutSize > IF_MAX_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", pPars->nLutSize );
        return 1;
    }

    if ( pPars->nCutsMax < 1 || pPars->nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    // enable truth table computation if choices are selected
    if ( (c = Abc_NtkGetChoiceNum( pNtk )) )
    {
//        if ( !Abc_FrameReadFlag("silentmode") )
//            Abc_Print( 0, "Performing LUT mapping with %d choices.\n", c );
        pPars->fExpRed = 0;
    }

    if ( pPars->fUseBat )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature only works for {4,5,6}-LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }

    if ( pPars->fEnableCheck07 + pPars->fUseCofVars + pPars->fUseDsdTune + (pPars->pLutStruct != NULL) > 1 )
    {
        Abc_Print( -1, "Only one additional check can be performed at the same time.\n" );
        return 1;
    }
    if ( pPars->fEnableCheck07 )
    {
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 7 )
        {
            Abc_Print( -1, "This feature only works for {6,7}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck07;
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseCofVars )
    {
        if ( !(pPars->nLutSize & 1) )
        {
            Abc_Print( -1, "This feature only works for odd-sized LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseDsdTune )
    {
        If_DsdMan_t * pDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pDsdMan == NULL )
        {
            Abc_Print( -1, "DSD manager is not available.\n" );
            return 1;
        }
        if ( pPars->nLutSize > If_DsdManVarNum(pDsdMan) )
        {
            Abc_Print( -1, "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n", pPars->nLutSize, If_DsdManVarNum(pDsdMan) );
            return 1;
        }
        if ( pPars->fDeriveLuts && If_DsdManGetCellStr(pDsdMan) == NULL )
        {
            Abc_Print( -1, "DSD manager is not matched with any particular cell.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
        pPars->fUseDsd = 1;
        If_DsdManSetNewAsUseless( pDsdMan );
    }
    if ( pPars->pLutStruct )
    {
        if ( pPars->fDsdBalance )
        {
            Abc_Print( -1, "Incompatible options (-S and -x).\n" );
            return 1;
        }
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 16 )
        {
            Abc_Print( -1, "This feature only works for [6;16]-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = pPars->fDelayOptLut ? NULL : If_CutPerformCheck16;
        pPars->fCutMin = 1;
    }

    // enable truth table computation if cut minimization is selected
    if ( pPars->fCutMin )
    {
        pPars->fTruth = 1;
        pPars->fExpRed = 0;
    }
    // modify the subgraph recording
    if ( pPars->fUserRecLib )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fDelayOptLut )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUseDsd     =  pPars->fDsdBalance || pPars->fDelayOptLut;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->nGateSize > 0 )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
        pPars->nLutSize    =  pPars->nGateSize;
    }

    if ( pPars->fUseDsd || pPars->fUseTtPerm )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
    }

    if ( pPars->fUseDsd )
    {
        int LutSize = (pPars->pLutStruct && pPars->pLutStruct[2] == 0)? pPars->pLutStruct[0] - '0' : 0;
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->pLutStruct && pPars->pLutStruct[2] != 0 )
        {
            printf( "DSD only works for LUT structures XY.\n" );
            return 0;
        }
        if ( p && pPars->nLutSize > If_DsdManVarNum(p) )
        {
            printf( "DSD manager has incompatible number of variables.\n" );
            return 0;
        }
        if ( p && LutSize != If_DsdManLutSize(p) && !pPars->fDsdBalance )
        {
            printf( "DSD manager has different LUT size.\n" );
            return 0;
        }
        if ( p == NULL )
        {
            if ( LutSize > DAU_MAX_VAR || pPars->nLutSize > DAU_MAX_VAR )
            {
                printf( "Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", LutSize, DAU_MAX_VAR );
                return 0;
            }
            Abc_FrameSetManDsd( If_DsdManAlloc(pPars->nLutSize, LutSize) );
        }
    }

    if ( pPars->fUserRecLib )
    {
        if ( !Abc_NtkRecIsRunning3() )
        {
            printf( "LMS manager is not running (use \"rec_start3\").\n" );
            return 0;
        }
        if ( Abc_NtkRecInputNum3() != pPars->nLutSize )
        {
            printf( "The number of library inputs (%d) different from the K parameters (%d).\n", Abc_NtkRecInputNum3(), pPars->nLutSize );
            return 0;
        }
    }
 
    // complain if truth tables are requested but the cut size is too large
    if ( pPars->fTruth && pPars->nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Truth tables cannot be computed for LUT larger than %d inputs.\n", IF_MAX_FUNC_LUTSIZE );
        return 1;
    }

    // disable cut-expansion if edge-based heuristics are selected
//    if ( pPars->fEdge )
//        pPars->fExpRed = 0;

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        // strash and balance the network
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Strashing before FPGA mapping has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkBalance( pNtkRes = pNtk, 0, 0, 1 );
        Abc_NtkDelete( pNtkRes );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Balancing before FPGA mapping has failed.\n" );
            return 1;
        }
        if ( !Abc_FrameReadFlag("silentmode") )
            Abc_Print( 1, "The network was strashed and balanced before FPGA mapping.\n" );
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_NtkDelete( pNtk );
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
        Abc_NtkDelete( pNtk );
    }
    else
    {
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%.2f", pPars->DelayTarget );
    if ( pPars->nLutSize == -1 )
        sprintf(LutSize, "library" );
    else
        sprintf(LutSize, "%d", pPars->nLutSize );
    Abc_Print( -2, "usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n" );
    Abc_Print( -2, "\t           performs FPGA technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n", IF_MAX_LUTSIZE+1, LutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n", pPars->nFlowIters );
    Abc_Print( -2, "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n", pPars->nAreaIters );
    Abc_Print( -2, "\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n", pPars->nGateSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-N num   : the max size of non-decomposable nodes [default = unused]\n", pPars->nNonDecLimit );
    Abc_Print( -2, "\t-T num   : the type of LUT structures [default = any]\n" );
    Abc_Print( -2, "\t-X num   : delay of AND-gate in LUT library units [default = %d]\n", pPars->nAndDelay );
    Abc_Print( -2, "\t-Y num   : area of AND-gate in LUT library units [default = %d]\n", pPars->nAndArea );
    Abc_Print( -2, "\t-D float : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-E float : sets epsilon used for tie-breaking [default = %f]\n", pPars->Epsilon );
    Abc_Print( -2, "\t-W float : sets wire delay between adjects LUTs [default = %f]\n", pPars->WireDelay );
    Abc_Print( -2, "\t-S str   : string representing the LUT structure [default = %s]\n", pPars->pLutStruct ? pPars->pLutStruct : "not used" );
    Abc_Print( -2, "\t-q       : toggles preprocessing using several starting points [default = %s]\n", pPars->fPreprocess? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : enables expansion/reduction of the best cuts [default = %s]\n", pPars->fExpRed? "yes": "no" );
    Abc_Print( -2, "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n", pPars->fLatchPaths? "yes": "no" );
    Abc_Print( -2, "\t-e       : uses edge-based cut selection heuristics [default = %s]\n", pPars->fEdge? "yes": "no" );
    Abc_Print( -2, "\t-p       : uses power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n", pPars->fDelayOptLut? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n", pPars->fBidec? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggles the use of one special feature [default = %s]\n", pPars->fUseBat? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles delay optimization by SOP balancing [default = %s]\n", pPars->fDelayOpt? "yes": "no" );
    Abc_Print( -2, "\t-x       : toggles delay optimization by DSD balancing [default = %s]\n", pPars->fDsdBalance? "yes": "no" );
    Abc_Print( -2, "\t-y       : toggles delay optimization with recorded library [default = %s]\n", pPars->fUserRecLib? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", pPars->fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck07? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggles using cofactoring variables [default = %s]\n", pPars->fUseCofVars? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n", pPars->fUseDsdTune? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-n       : toggles computing DSDs of the cut functions [default = %s]\n", pPars->fUseDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles computing truth tables in a new way [default = %s]\n", pPars->fUseTtPerm? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}